

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymf271.c
# Opt level: O0

void ymf271_alloc_rom(void *info,UINT32 memsize)

{
  void *pvVar1;
  YMF271Chip *chip;
  UINT32 memsize_local;
  void *info_local;
  
  if (*(UINT32 *)((long)info + 0x2d88) != memsize) {
    pvVar1 = realloc(*(void **)((long)info + 0x2d80),(ulong)memsize);
    *(void **)((long)info + 0x2d80) = pvVar1;
    *(UINT32 *)((long)info + 0x2d88) = memsize;
    memset(*(void **)((long)info + 0x2d80),0xff,(ulong)memsize);
  }
  return;
}

Assistant:

static void ymf271_alloc_rom(void* info, UINT32 memsize)
{
	YMF271Chip *chip = (YMF271Chip *)info;
	
	if (chip->mem_size == memsize)
		return ;
	
	chip->mem_base = (UINT8*)realloc(chip->mem_base, memsize);
	chip->mem_size = memsize;
	memset(chip->mem_base, 0xFF, memsize);
	
	return;
}